

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_band.c
# Opt level: O1

int SUNMatZero_Band(SUNMatrix A)

{
  SUNMatrix_ID SVar1;
  long lVar2;
  int iVar3;
  
  SVar1 = SUNMatGetID(A);
  iVar3 = -0x2bd;
  if (SVar1 == SUNMATRIX_BAND) {
    lVar2 = (long)*(int *)((long)A->content + 0x20);
    if (lVar2 < 1) {
      iVar3 = 0;
    }
    else {
      iVar3 = 0;
      memset(*(void **)((long)A->content + 0x18),0,lVar2 << 3);
    }
  }
  return iVar3;
}

Assistant:

int SUNMatZero_Band(SUNMatrix A)
{
  sunindextype i;
  realtype *Adata;

  /* Verify that A is a band matrix */
  if (SUNMatGetID(A) != SUNMATRIX_BAND)
    return SUNMAT_ILL_INPUT;

  /* Perform operation */
  Adata = SM_DATA_B(A);
  for (i=0; i<SM_LDATA_B(A); i++)
    Adata[i] = ZERO;
  return SUNMAT_SUCCESS;
}